

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standard_buffer_manager.cpp
# Opt level: O2

vector<duckdb::TemporaryFileInformation,_true> * __thiscall
duckdb::StandardBufferManager::GetTemporaryFiles
          (vector<duckdb::TemporaryFileInformation,_true> *__return_storage_ptr__,
          StandardBufferManager *this)

{
  mutex *__mutex;
  pointer pTVar1;
  type this_00;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  (__return_storage_ptr__->
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>)
  .
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>)
  .
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>)
  .
  super__Vector_base<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((this->temporary_directory).path._M_string_length != 0) {
    __mutex = &(this->temporary_directory).lock;
    ::std::mutex::lock(__mutex);
    if ((this->temporary_directory).handle.
        super_unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::TemporaryDirectoryHandle_*,_std::default_delete<duckdb::TemporaryDirectoryHandle>_>
        .super__Head_base<0UL,_duckdb::TemporaryDirectoryHandle_*,_false>._M_head_impl !=
        (TemporaryDirectoryHandle *)0x0) {
      pTVar1 = unique_ptr<duckdb::TemporaryDirectoryHandle,_std::default_delete<duckdb::TemporaryDirectoryHandle>,_true>
               ::operator->(&(this->temporary_directory).handle);
      this_00 = unique_ptr<duckdb::TemporaryFileManager,_std::default_delete<duckdb::TemporaryFileManager>,_true>
                ::operator*(&pTVar1->temp_file);
      TemporaryFileManager::GetTemporaryFiles
                ((vector<duckdb::TemporaryFileInformation,_true> *)&local_40,this_00);
      ::std::
      vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>::
      _M_move_assign(&__return_storage_ptr__->
                      super_vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
                     ,&local_40);
      ::std::
      vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>::
      ~vector((vector<duckdb::TemporaryFileInformation,_std::allocator<duckdb::TemporaryFileInformation>_>
               *)&local_40);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_40._M_unused._M_object = FileSystem::GetFileSystem(this->db);
    local_28 = ::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/standard_buffer_manager.cpp:592:41)>
               ::_M_invoke;
    local_30 = ::std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/storage/standard_buffer_manager.cpp:592:41)>
               ::_M_manager;
    local_40._8_8_ = __return_storage_ptr__;
    (*((FileSystem *)local_40._M_unused._0_8_)->_vptr_FileSystem[0x10])
              (local_40._M_unused._M_object,&this->temporary_directory,&local_40,0);
    ::std::_Function_base::~_Function_base((_Function_base *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<TemporaryFileInformation> StandardBufferManager::GetTemporaryFiles() {
	vector<TemporaryFileInformation> result;
	if (temporary_directory.path.empty()) {
		return result;
	}
	{
		lock_guard<mutex> temp_handle_guard(temporary_directory.lock);
		if (temporary_directory.handle) {
			result = temporary_directory.handle->GetTempFile().GetTemporaryFiles();
		}
	}
	auto &fs = FileSystem::GetFileSystem(db);
	fs.ListFiles(temporary_directory.path, [&](const string &name, bool is_dir) {
		if (is_dir) {
			return;
		}
		if (!StringUtil::EndsWith(name, ".block")) {
			return;
		}

		// Another process or thread can delete the file before we can get its file size.
		auto handle = fs.OpenFile(name, FileFlags::FILE_FLAGS_READ | FileFlags::FILE_FLAGS_NULL_IF_NOT_EXISTS);
		if (!handle) {
			return;
		}

		TemporaryFileInformation info;
		info.path = name;
		info.size = NumericCast<idx_t>(fs.GetFileSize(*handle));
		handle.reset();
		result.push_back(info);
	});
	return result;
}